

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Entity_State_PDU::Entity_State_PDU
          (Entity_State_PDU *this,EntityIdentifier *EI,ForceID ID,EntityType *Type,
          EntityType *AltType,Vector *EntityLinearVelocity,WorldCoordinates *EntityLocation,
          EulerAngles *EntityOrientation,EntityAppearance *EA,DeadReckoningParameter *DRP,
          EntityMarking *EM,EntityCapabilities *EC)

{
  undefined8 uVar1;
  KFLOAT64 KVar2;
  KUINT16 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KUINT8 KVar7;
  KUINT8 KVar8;
  KFLOAT32 KVar9;
  KOCTET KVar10;
  KOCTET KVar11;
  KOCTET KVar12;
  KOCTET KVar13;
  KOCTET KVar14;
  KOCTET KVar15;
  KOCTET KVar16;
  KCHAR8 KVar17;
  KCHAR8 KVar18;
  KCHAR8 KVar19;
  KCHAR8 KVar20;
  KCHAR8 KVar21;
  KCHAR8 KVar22;
  KCHAR8 KVar23;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Entity_State_PDU_002147d8;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00211d38;
  KVar3 = (EI->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16SiteID =
       (EI->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar3;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00211ce0;
  *(undefined2 *)&(this->m_EntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EI->super_SimulationIdentifier).field_0xc;
  this->m_ui8ForceID = (KUINT8)ID;
  this->m_ui8NumOfVariableParams = '\0';
  (this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00216ac0;
  KVar4 = Type->m_ui8Domain;
  KVar3 = Type->m_ui16Country;
  KVar5 = Type->m_ui8Category;
  KVar6 = Type->m_ui8SubCategory;
  KVar7 = Type->m_ui8Specific;
  KVar8 = Type->m_ui8Extra;
  (this->m_EntityType).m_ui8EntityKind = Type->m_ui8EntityKind;
  (this->m_EntityType).m_ui8Domain = KVar4;
  (this->m_EntityType).m_ui16Country = KVar3;
  (this->m_EntityType).m_ui8Category = KVar5;
  (this->m_EntityType).m_ui8SubCategory = KVar6;
  (this->m_EntityType).m_ui8Specific = KVar7;
  (this->m_EntityType).m_ui8Extra = KVar8;
  (this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00216ac0;
  KVar4 = AltType->m_ui8Domain;
  KVar3 = AltType->m_ui16Country;
  KVar5 = AltType->m_ui8Category;
  KVar6 = AltType->m_ui8SubCategory;
  KVar7 = AltType->m_ui8Specific;
  KVar8 = AltType->m_ui8Extra;
  (this->m_AltEntityType).m_ui8EntityKind = AltType->m_ui8EntityKind;
  (this->m_AltEntityType).m_ui8Domain = KVar4;
  (this->m_AltEntityType).m_ui16Country = KVar3;
  (this->m_AltEntityType).m_ui8Category = KVar5;
  (this->m_AltEntityType).m_ui8SubCategory = KVar6;
  (this->m_AltEntityType).m_ui8Specific = KVar7;
  (this->m_AltEntityType).m_ui8Extra = KVar8;
  (this->m_EntityLinearVelocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00213d98;
  KVar9 = EntityLinearVelocity->m_f32Y;
  (this->m_EntityLinearVelocity).m_f32X = EntityLinearVelocity->m_f32X;
  (this->m_EntityLinearVelocity).m_f32Y = KVar9;
  (this->m_EntityLinearVelocity).m_f32Z = EntityLinearVelocity->m_f32Z;
  (this->m_EntityLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00211e70;
  KVar2 = EntityLocation->m_f64Y;
  (this->m_EntityLocation).m_f64X = EntityLocation->m_f64X;
  (this->m_EntityLocation).m_f64Y = KVar2;
  (this->m_EntityLocation).m_f64Z = EntityLocation->m_f64Z;
  (this->m_EntityOrientation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EulerAngles_00216b18;
  KVar9 = EntityOrientation->m_f32Theta;
  (this->m_EntityOrientation).m_f32Psi = EntityOrientation->m_f32Psi;
  (this->m_EntityOrientation).m_f32Theta = KVar9;
  (this->m_EntityOrientation).m_f32Phi = EntityOrientation->m_f32Phi;
  (this->m_EntityAppearance).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityAppearance_002169b8;
  (this->m_EntityAppearance).m_Appearance = EA->m_Appearance;
  (this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DeadReckoningParameter_002167a8;
  KVar10 = DRP->m_OtherParams[0];
  KVar11 = DRP->m_OtherParams[1];
  KVar12 = DRP->m_OtherParams[2];
  KVar13 = DRP->m_OtherParams[3];
  KVar14 = DRP->m_OtherParams[4];
  KVar15 = DRP->m_OtherParams[5];
  KVar16 = DRP->m_OtherParams[6];
  uVar1 = *(undefined8 *)(DRP->m_OtherParams + 7);
  (this->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm = DRP->m_ui8DeadRecknoningAlgorithm;
  (this->m_DeadReckoningParameter).m_OtherParams[0] = KVar10;
  (this->m_DeadReckoningParameter).m_OtherParams[1] = KVar11;
  (this->m_DeadReckoningParameter).m_OtherParams[2] = KVar12;
  (this->m_DeadReckoningParameter).m_OtherParams[3] = KVar13;
  (this->m_DeadReckoningParameter).m_OtherParams[4] = KVar14;
  (this->m_DeadReckoningParameter).m_OtherParams[5] = KVar15;
  (this->m_DeadReckoningParameter).m_OtherParams[6] = KVar16;
  *(undefined8 *)((this->m_DeadReckoningParameter).m_OtherParams + 7) = uVar1;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00213d98;
  KVar9 = (DRP->m_LinearAcceleration).m_f32Y;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X = (DRP->m_LinearAcceleration).m_f32X;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y = KVar9;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z = (DRP->m_LinearAcceleration).m_f32Z;
  (this->m_DeadReckoningParameter).m_AngularVelocity.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00213d98;
  KVar9 = (DRP->m_AngularVelocity).m_f32Y;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32X = (DRP->m_AngularVelocity).m_f32X;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y = KVar9;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z = (DRP->m_AngularVelocity).m_f32Z;
  (this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityMarking_00216a68;
  KVar17 = EM->m_sEntityMarkingString[0];
  KVar18 = EM->m_sEntityMarkingString[1];
  KVar19 = EM->m_sEntityMarkingString[2];
  KVar20 = EM->m_sEntityMarkingString[3];
  KVar21 = EM->m_sEntityMarkingString[4];
  KVar22 = EM->m_sEntityMarkingString[5];
  KVar23 = EM->m_sEntityMarkingString[6];
  uVar1 = *(undefined8 *)(EM->m_sEntityMarkingString + 4);
  (this->m_EntityMarking).m_ui8EntityMarkingCharacterSet = EM->m_ui8EntityMarkingCharacterSet;
  (this->m_EntityMarking).m_sEntityMarkingString[0] = KVar17;
  (this->m_EntityMarking).m_sEntityMarkingString[1] = KVar18;
  (this->m_EntityMarking).m_sEntityMarkingString[2] = KVar19;
  (this->m_EntityMarking).m_sEntityMarkingString[3] = KVar20;
  (this->m_EntityMarking).m_sEntityMarkingString[4] = KVar21;
  (this->m_EntityMarking).m_sEntityMarkingString[5] = KVar22;
  (this->m_EntityMarking).m_sEntityMarkingString[6] = KVar23;
  *(undefined8 *)((this->m_EntityMarking).m_sEntityMarkingString + 4) = uVar1;
  (this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityCapabilities_00216a10;
  (this->m_EntityCapabilities).field_0 = EC->field_0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_pDrCalc = (DeadReckoningCalculator *)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x01';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x90;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Entity_State_PDU::Entity_State_PDU( const EntityIdentifier & EI, ForceID ID, const EntityType & Type, const EntityType & AltType,
                                    const Vector & EntityLinearVelocity, const WorldCoordinates & EntityLocation,
                                    const EulerAngles & EntityOrientation, const EntityAppearance & EA,
                                    const DeadReckoningParameter & DRP, const EntityMarking & EM,
                                    const EntityCapabilities & EC ) :
    m_EntityID( EI ),
    m_ui8ForceID( ID ),
    m_ui8NumOfVariableParams( 0 ),
    m_EntityType( Type ),
    m_AltEntityType( AltType ),
    m_EntityLinearVelocity( EntityLinearVelocity ),
    m_EntityLocation( EntityLocation ),
    m_EntityOrientation( EntityOrientation ),
    m_EntityAppearance( EA ),
    m_DeadReckoningParameter( DRP ),
    m_EntityMarking( EM ),
    m_EntityCapabilities( EC ),
    m_pDrCalc( 0 )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = Entity_State_PDU_Type;
    m_ui16PDULength = ENTITY_STATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}